

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser_test.cc
# Opt level: O1

void __thiscall DyndepParserTestNoOutColon::Run(DyndepParserTestNoOutColon *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  string err;
  char kInput [34];
  DyndepParser parser;
  string local_158;
  string local_138;
  char local_118 [48];
  DyndepParser local_e8;
  
  builtin_strncpy(local_118,"ninja_dyndep_version = 1\nbuild :\n",0x22);
  DyndepParser::DyndepParser
            (&local_e8,&(this->super_DyndepParserTest).state_,
             (FileReader *)&(this->super_DyndepParserTest).fs_,
             &(this->super_DyndepParserTest).dyndep_file_);
  pTVar1 = g_current_test;
  local_138._M_string_length = 0;
  local_138.field_2._M_local_buf[0] = '\0';
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  sVar4 = strlen(local_118);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,local_118,local_118 + sVar4);
  bVar2 = DyndepParser::ParseTest(&local_e8,&local_158,&local_138);
  testing::Test::Check
            (pTVar1,!bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0xe6,"parser.ParseTest(kInput, &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  pTVar1 = g_current_test;
  iVar3 = std::__cxx11::string::compare((char *)&local_138);
  testing::Test::Check
            (pTVar1,iVar3 == 0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/dyndep_parser_test.cc"
             ,0xe9,"\"input:2: expected path\\n\" \"build :\\n\" \"      ^ near here\" == err");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,
                    CONCAT71(local_138.field_2._M_allocated_capacity._1_7_,
                             local_138.field_2._M_local_buf[0]) + 1);
  }
  local_e8.super_Parser._vptr_Parser = (_func_int **)&PTR_Parse_001d8c30;
  local_e8.env_.super_Env._vptr_Env = (_func_int **)&PTR__BindingEnv_001d8ce8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Rule_*>_>_>
  ::~_Rb_tree(&local_e8.env_.rules_._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e8.env_.bindings_._M_t);
  return;
}

Assistant:

TEST_F(DyndepParserTest, NoOutColon) {
  const char kInput[] =
"ninja_dyndep_version = 1\n"
"build :\n";
  DyndepParser parser(&state_, &fs_, &dyndep_file_);
  string err;
  EXPECT_FALSE(parser.ParseTest(kInput, &err));
  EXPECT_EQ("input:2: expected path\n"
            "build :\n"
            "      ^ near here", err);
}